

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap_str.c
# Opt level: O3

char * ap_str_trim_from_set(char *str,char *set)

{
  if (set != (char *)0x0 && str != (char *)0x0) {
    ap_str_trim_head_from_set(str,set);
    ap_str_trim_tail_from_set(str,set);
  }
  return str;
}

Assistant:

char * ap_str_trim_from_set (char *str, const char *set)
{
	if (str == NULL || set == NULL)
	{
		goto finish;
	}

	str = ap_str_trim_head_from_set (str, set);
	str = ap_str_trim_tail_from_set (str, set);

finish:
	return str;
}